

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::SolveData::reset(SolveData *this)

{
  long *plVar1;
  Enumerator *this_00;
  
  if (this->active != (SolveStrategy *)0x0) {
    SolveStrategy::interrupt(this->active,9);
    SolveStrategy::release(this->active);
    this->active = (SolveStrategy *)0x0;
  }
  plVar1 = (long *)((this->algo).ptr_ & 0xfffffffffffffffe);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
  }
  this_00 = (Enumerator *)((this->en).ptr_ & 0xfffffffffffffffe);
  if (this_00 != (Enumerator *)0x0) {
    Enumerator::reset(this_00);
  }
  this->prepared = false;
  this->solved = false;
  return;
}

Assistant:

void ClaspFacade::SolveData::reset() {
	if (active)     { active->interrupt(SolveStrategy::SIGCANCEL); active->release(); active = 0; }
	if (algo.get()) { algo->resetSolve(); }
	if (en.get())   { en->reset(); }
	prepared = solved = false;
}